

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O2

qpdf_offset_t __thiscall FileInputSource::findAndSkipNextEOL(FileInputSource *this)

{
  bool bVar1;
  int iVar2;
  qpdf_offset_t qVar3;
  undefined4 extraout_var;
  void *pvVar4;
  void *pvVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char ch;
  long local_2840;
  char buf [10240];
  size_t __n;
  
  bVar1 = false;
  local_2840 = 0;
  do {
    while( true ) {
      if (bVar1) {
        return local_2840;
      }
      qVar3 = QUtil::tell(this->file);
      iVar2 = (*(this->super_InputSource)._vptr_InputSource[7])(this,buf,0x2800);
      __n = CONCAT44(extraout_var,iVar2);
      if (__n != 0) break;
      iVar2 = (*(this->super_InputSource)._vptr_InputSource[4])(this);
      local_2840 = CONCAT44(extraout_var_00,iVar2);
      bVar1 = true;
    }
    pvVar4 = memchr(buf,0xd,__n);
    pvVar5 = memchr(buf,10,__n);
    if (pvVar5 != (void *)0x0 && pvVar4 != (void *)0x0) {
      if (pvVar4 <= pvVar5) {
        pvVar5 = pvVar4;
      }
      goto LAB_0011d409;
    }
    if (pvVar4 != (void *)0x0) {
      pvVar5 = pvVar4;
    }
    if (pvVar5 != (void *)0x0) {
LAB_0011d409:
      local_2840 = (long)pvVar5 + (qVar3 - (long)buf);
      (*(this->super_InputSource)._vptr_InputSource[5])
                (this,(long)pvVar5 + (qVar3 - (long)buf) + 1,0);
LAB_0011d430:
      if (!bVar1) {
        iVar2 = (*(this->super_InputSource)._vptr_InputSource[7])(this,&ch,1);
        if (CONCAT44(extraout_var_01,iVar2) != 0) break;
        goto LAB_0011d469;
      }
    }
  } while( true );
  if ((ch != '\n') && (ch != '\r')) {
    (*(this->super_InputSource)._vptr_InputSource[8])(this,(ulong)(uint)(int)ch);
LAB_0011d469:
    bVar1 = true;
  }
  goto LAB_0011d430;
}

Assistant:

qpdf_offset_t
FileInputSource::findAndSkipNextEOL()
{
    qpdf_offset_t result = 0;
    bool done = false;
    char buf[10240];
    while (!done) {
        qpdf_offset_t cur_offset = QUtil::tell(this->file);
        size_t len = this->read(buf, sizeof(buf));
        if (len == 0) {
            done = true;
            result = this->tell();
        } else {
            char* p1 = static_cast<char*>(memchr(buf, '\r', len));
            char* p2 = static_cast<char*>(memchr(buf, '\n', len));
            char* p = (p1 && p2) ? std::min(p1, p2) : p1 ? p1 : p2;
            if (p) {
                result = cur_offset + (p - buf);
                // We found \r or \n.  Keep reading until we get past \r and \n characters.
                this->seek(result + 1, SEEK_SET);
                char ch;
                while (!done) {
                    if (this->read(&ch, 1) == 0) {
                        done = true;
                    } else if (!((ch == '\r') || (ch == '\n'))) {
                        this->unreadCh(ch);
                        done = true;
                    }
                }
            }
        }
    }
    return result;
}